

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validationinterface.cpp
# Opt level: O0

void __thiscall
ValidationSignals::TransactionRemovedFromMempool
          (ValidationSignals *this,CTransactionRef *tx,MemPoolRemovalReason reason,
          uint64_t mempool_sequence)

{
  string_view source_file;
  bool bVar1;
  pointer pTVar2;
  undefined4 in_EDX;
  LogFlags in_RDI;
  long in_FS_OFFSET;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unaff_retaddr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000008;
  char *local_name;
  anon_class_40_4_21c3dbda_for_event event;
  undefined4 in_stack_fffffffffffffe38;
  undefined4 in_stack_fffffffffffffe3c;
  anon_class_40_4_21c3dbda_for_event *in_stack_fffffffffffffe40;
  anon_class_40_4_21c3dbda_for_event *in_stack_fffffffffffffe48;
  anon_class_72_4_f3bf531b *in_stack_fffffffffffffe50;
  function<void_()> *in_stack_fffffffffffffe58;
  MemPoolRemovalReason *in_stack_fffffffffffffe78;
  char *pcVar3;
  ConstevalFormatString<4U> in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffef0;
  undefined1 in_stack_fffffffffffffef4 [12];
  string_view in_stack_ffffffffffffff00;
  undefined1 local_e0 [64];
  anon_class_40_4_21c3dbda_for_event local_a0;
  undefined4 local_6c;
  function<void_()> local_48;
  Level in_stack_ffffffffffffffe0;
  char **in_stack_fffffffffffffff0;
  element_type *args_1;
  
  args_1 = *(element_type **)(in_FS_OFFSET + 0x28);
  local_6c = in_EDX;
  std::shared_ptr<const_CTransaction>::shared_ptr
            ((shared_ptr<const_CTransaction> *)
             CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
             (shared_ptr<const_CTransaction> *)0x84eeed);
  local_a0.mempool_sequence._0_4_ = local_6c;
  local_a0.tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x111850b;
  bVar1 = ::LogAcceptCategory(CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),Trace);
  if (bVar1) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffe58,
               (char *)in_stack_fffffffffffffe50);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffe58,
               (char *)in_stack_fffffffffffffe50);
    pcVar3 = "Enqueuing %s: txid=%s wtxid=%s reason=%s\n";
    std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
    CTransaction::GetHash
              ((CTransaction *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
    transaction_identifier<false>::ToString_abi_cxx11_
              ((transaction_identifier<false> *)in_stack_fffffffffffffe40);
    std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
    CTransaction::GetWitnessHash
              ((CTransaction *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
    transaction_identifier<true>::ToString_abi_cxx11_
              ((transaction_identifier<true> *)in_stack_fffffffffffffe40);
    in_stack_fffffffffffffe40 = (anon_class_40_4_21c3dbda_for_event *)pcVar3;
    RemovalReasonToString_abi_cxx11_(in_stack_fffffffffffffe78);
    in_stack_fffffffffffffe58 = &local_48;
    in_stack_fffffffffffffe50 = (anon_class_72_4_f3bf531b *)&stack0xffffffffffffffd8;
    in_stack_fffffffffffffe48 = &local_a0;
    in_stack_fffffffffffffe38 = 1;
    source_file._4_12_ = in_stack_fffffffffffffef4;
    source_file._M_len._0_4_ = in_stack_fffffffffffffef0;
    LogPrintFormatInternal<char_const*,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
              (in_stack_ffffffffffffff00,source_file,(int)((ulong)in_stack_fffffffffffffe40 >> 0x20)
               ,in_RDI,in_stack_ffffffffffffffe0,in_stack_fffffffffffffee8,in_stack_fffffffffffffff0
               ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_1,
               unaff_retaddr,in_stack_00000008);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
  }
  std::unique_ptr<ValidationSignalsImpl,_std::default_delete<ValidationSignalsImpl>_>::operator->
            ((unique_ptr<ValidationSignalsImpl,_std::default_delete<ValidationSignalsImpl>_> *)
             CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
  pTVar2 = std::
           unique_ptr<util::TaskRunnerInterface,_std::default_delete<util::TaskRunnerInterface>_>::
           operator->((unique_ptr<util::TaskRunnerInterface,_std::default_delete<util::TaskRunnerInterface>_>
                       *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
  std::shared_ptr<const_CTransaction>::shared_ptr
            ((shared_ptr<const_CTransaction> *)
             CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
             (shared_ptr<const_CTransaction> *)0x84f148);
  TransactionRemovedFromMempool(std::shared_ptr<CTransaction_const>const&,MemPoolRemovalReason,unsigned_long)
  ::$_1::__1(in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
  std::function<void()>::
  function<ValidationSignals::TransactionRemovedFromMempool(std::shared_ptr<CTransaction_const>const&,MemPoolRemovalReason,unsigned_long)::__0,void>
            (in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
  (*pTVar2->_vptr_TaskRunnerInterface[2])(pTVar2,local_e0);
  std::function<void_()>::~function
            ((function<void_()> *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
  TransactionRemovedFromMempool(std::shared_ptr<CTransaction_const>const&,MemPoolRemovalReason,unsigned_long)
  ::$_0::~__0((anon_class_72_4_f3bf531b *)
              CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
  TransactionRemovedFromMempool(std::shared_ptr<CTransaction_const>const&,MemPoolRemovalReason,unsigned_long)
  ::$_1::~__1((anon_class_40_4_21c3dbda_for_event *)
              CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
  if (*(element_type **)(in_FS_OFFSET + 0x28) != args_1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void ValidationSignals::TransactionRemovedFromMempool(const CTransactionRef& tx, MemPoolRemovalReason reason, uint64_t mempool_sequence) {
    auto event = [tx, reason, mempool_sequence, this] {
        m_internals->Iterate([&](CValidationInterface& callbacks) { callbacks.TransactionRemovedFromMempool(tx, reason, mempool_sequence); });
    };
    ENQUEUE_AND_LOG_EVENT(event, "%s: txid=%s wtxid=%s reason=%s", __func__,
                          tx->GetHash().ToString(),
                          tx->GetWitnessHash().ToString(),
                          RemovalReasonToString(reason));
}